

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int PHYSFS_flush(PHYSFS_File *handle)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 1;
  if (*(char *)&handle[1].opaque == '\0') {
    if (handle[5].opaque != handle[6].opaque) {
      pvVar1 = handle->opaque;
      lVar3 = (**(code **)((long)pvVar1 + 0x18))
                        (pvVar1,(long)handle[6].opaque + (long)handle[3].opaque);
      if (lVar3 < 1) {
        iVar2 = 0;
      }
      else {
        handle[5].opaque = (void *)0x0;
        handle[6].opaque = (void *)0x0;
        if (*(code **)((long)pvVar1 + 0x40) != (code *)0x0) {
          iVar2 = (**(code **)((long)pvVar1 + 0x40))(pvVar1);
          return iVar2;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int PHYSFS_flush(PHYSFS_File *handle)
{
    FileHandle *fh = (FileHandle *) handle;
    PHYSFS_Io *io;
    PHYSFS_sint64 rc;

    if ((fh->forReading) || (fh->bufpos == fh->buffill))
        return 1;  /* open for read or buffer empty are successful no-ops. */

    /* dump buffer to disk. */
    io = fh->io;
    rc = io->write(io, fh->buffer + fh->bufpos, fh->buffill - fh->bufpos);
    BAIL_IF_ERRPASS(rc <= 0, 0);
    fh->bufpos = fh->buffill = 0;
    return io->flush ? io->flush(io) : 1;
}